

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-optimizer.cpp
# Opt level: O2

bool is_best(context *ctx,result *current,result *best,objective_function_type type)

{
  double dVar1;
  pointer psVar2;
  
  if (current->status == success) {
    if (best->status == success) {
      psVar2 = (current->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = ((best->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
      if (type == maximize) {
        if (psVar2->value <= dVar1) {
          return false;
        }
      }
      else if (dVar1 <= psVar2->value) {
        return false;
      }
    }
    else {
      psVar2 = (current->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    baryonyx::notice<double>(ctx,"  - branch optimization found solution {:G}\n",&psVar2->value);
  }
  else {
    if (best->status == success) {
      return false;
    }
    if (best->constraints <= current->constraints) {
      return false;
    }
    baryonyx::notice<int>
              (ctx,"  - branch optimization remaining_constraint {}\n",
               &current->remaining_constraints);
  }
  return true;
}

Assistant:

static bool
is_best(const baryonyx::context& ctx,
        const baryonyx::result& current,
        const baryonyx::result& best,
        baryonyx::objective_function_type type)
{
    if (is_best(current, best, type)) {
        if (current)
            baryonyx::notice(ctx,
                             "  - branch optimization found solution {:G}\n",
                             current.solutions.front().value);
        else
            baryonyx::notice(
              ctx,
              "  - branch optimization remaining_constraint {}\n",
              current.remaining_constraints);

        return true;
    }

    return false;
}